

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

bool __thiscall ValueType::IsNotNativeArray(ValueType *this)

{
  bool bVar1;
  ObjectType OVar2;
  ValueType *this_local;
  
  bVar1 = IsNotObject(this);
  if (bVar1) {
    return true;
  }
  bVar1 = IsObject(this);
  if (bVar1) {
    OVar2 = GetObjectType(this);
    if ((OVar2 != ObjectWithArray) && (OVar2 = GetObjectType(this), OVar2 != Array)) {
      return true;
    }
    bVar1 = HasVarElements(this);
    return bVar1;
  }
  return false;
}

Assistant:

bool ValueType::IsNotNativeArray() const
{
    return
        IsNotObject() ||
        (
            IsObject() &&
            ((GetObjectType() != ObjectType::ObjectWithArray && GetObjectType() != ObjectType::Array) || HasVarElements())
        );
}